

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::anon_unknown_14::MthdSifmPitch::is_valid_val(MthdSifmPitch *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
       chipset.card_type < 4) ||
     (uVar1 = (this->super_SingleMthdTest).super_MthdTest.cls, uVar1 == 0x37)) {
    bVar4 = (this->super_SingleMthdTest).super_MthdTest.val < 0x2000;
  }
  else {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    bVar4 = false;
    if ((uVar2 < 0x2000000) && (0xfffffffd < (uVar2 >> 0x10 & 0xff) - 3)) {
      uVar3 = uVar1 - 99;
      if (((uVar3 < 0x15) && ((0x100011U >> (uVar3 & 0x1f) & 1) != 0)) && ((uVar2 & 0xe000) != 0)) {
        return false;
      }
      return true;
    }
  }
  return bVar4;
}

Assistant:

bool is_valid_val() override {
		if (chipset.card_type < 4 || cls == 0x37) {
			return !(val & ~0x1fff);
		} else {
			if (!extr(val, 16, 8))
				return false;
			if (extr(val, 16, 8) > 2)
				return false;
			if (extr(val, 24, 8) > 1)
				return false;
			if (cls == 0x37 || cls == 0x77 || cls == 0x63 || cls == 0x67) {
				if (val & 0xe000)
					return false;
			}
			return true;
		}
	}